

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

uint32 __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::UnescapeToTempBuf
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr p,EncodedCharPtr last)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 local_2c;
  char16 local_2a;
  undefined1 local_27;
  bool local_26;
  bool local_25;
  char16 upper;
  char16 lower;
  bool gotCodePoint;
  bool isMultiChar;
  bool hasEscape;
  EncodedCharPtr puStack_20;
  codepoint_t codePoint;
  EncodedCharPtr last_local;
  EncodedCharPtr p_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  puStack_20 = last;
  last_local = p;
  p_local = (EncodedCharPtr)this;
  TemporaryBuffer::Reset(&this->m_tempChBuf);
  do {
    if (puStack_20 <= last_local) {
      return (this->m_tempChBuf).m_ichCur;
    }
    local_27 = TryReadCodePoint<false>
                         (this,&last_local,puStack_20,(codepoint_t *)&upper,&local_25,&local_26);
    if (!(bool)local_27) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x22c,"(gotCodePoint)","gotCodePoint");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (0x10ffff < _upper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x22d,"(codePoint < 0x110000)","codePoint < 0x110000");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (_upper < 0x10000) {
      TemporaryBuffer::AppendCh(&this->m_tempChBuf,_upper & 0xffff);
    }
    else {
      Js::NumberUtilities::CodePointAsSurrogatePair(_upper,&local_2a,&local_2c);
      TemporaryBuffer::AppendCh(&this->m_tempChBuf,(uint)(ushort)local_2a);
      TemporaryBuffer::AppendCh(&this->m_tempChBuf,(uint)(ushort)local_2c);
    }
  } while( true );
}

Assistant:

uint32 Scanner<EncodingPolicy>::UnescapeToTempBuf(EncodedCharPtr p, EncodedCharPtr last)
{
    m_tempChBuf.Reset();
    while( p < last )
    {
        codepoint_t codePoint;
        bool hasEscape, isMultiChar;
        bool gotCodePoint = TryReadCodePoint<false>(p, last, &codePoint, &hasEscape, &isMultiChar);
        Assert(gotCodePoint);
        Assert(codePoint < 0x110000);
        if (codePoint < 0x10000)
        {
            m_tempChBuf.AppendCh((OLECHAR)codePoint);
        }
        else
        {
            char16 lower, upper;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &upper);
            m_tempChBuf.AppendCh(lower);
            m_tempChBuf.AppendCh(upper);
        }
    }
    return m_tempChBuf.m_ichCur;
}